

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

int xmlGcMemSetup(xmlFreeFunc freeFunc,xmlMallocFunc mallocFunc,xmlMallocFunc mallocAtomicFunc,
                 xmlReallocFunc reallocFunc,xmlStrdupFunc strdupFunc)

{
  xmlStrdupFunc strdupFunc_local;
  xmlReallocFunc reallocFunc_local;
  xmlMallocFunc mallocAtomicFunc_local;
  xmlMallocFunc mallocFunc_local;
  xmlFreeFunc freeFunc_local;
  
  if (freeFunc == (xmlFreeFunc)0x0) {
    freeFunc_local._4_4_ = -1;
  }
  else if (mallocFunc == (xmlMallocFunc)0x0) {
    freeFunc_local._4_4_ = -1;
  }
  else if (mallocAtomicFunc == (xmlMallocFunc)0x0) {
    freeFunc_local._4_4_ = -1;
  }
  else if (reallocFunc == (xmlReallocFunc)0x0) {
    freeFunc_local._4_4_ = -1;
  }
  else if (strdupFunc == (xmlStrdupFunc)0x0) {
    freeFunc_local._4_4_ = -1;
  }
  else {
    freeFunc_local._4_4_ = 0;
    xmlFree = freeFunc;
    xmlMalloc = mallocFunc;
    xmlMallocAtomic = mallocAtomicFunc;
    xmlRealloc = reallocFunc;
    xmlMemStrdup = strdupFunc;
  }
  return freeFunc_local._4_4_;
}

Assistant:

int
xmlGcMemSetup(xmlFreeFunc freeFunc, xmlMallocFunc mallocFunc,
              xmlMallocFunc mallocAtomicFunc, xmlReallocFunc reallocFunc,
	      xmlStrdupFunc strdupFunc) {
    if (freeFunc == NULL)
	return(-1);
    if (mallocFunc == NULL)
	return(-1);
    if (mallocAtomicFunc == NULL)
	return(-1);
    if (reallocFunc == NULL)
	return(-1);
    if (strdupFunc == NULL)
	return(-1);
    xmlFree = freeFunc;
    xmlMalloc = mallocFunc;
    xmlMallocAtomic = mallocAtomicFunc;
    xmlRealloc = reallocFunc;
    xmlMemStrdup = strdupFunc;
    return(0);
}